

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

void Saig_Bmc3ManStop(Gia_ManBmc_t *p)

{
  sat_solver *psVar1;
  char *pcVar2;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Hsh_IntMan_t *__ptr_01;
  Vec_Wrd_t *__ptr_02;
  int i;
  long lVar3;
  int level;
  ulong uVar4;
  Vec_Int_t *__ptr_03;
  char **__ptr_04;
  long lVar5;
  
  if (p->pPars->fVerbose != 0) {
    psVar1 = p->pSat;
    uVar4 = 0;
    for (lVar3 = 0; level = (int)uVar4, lVar3 < psVar1->size; lVar3 = lVar3 + 1) {
      pcVar2 = psVar1->pFreqs;
      if (pcVar2[lVar3] != '\0') {
        pcVar2[lVar3] = '\0';
        uVar4 = (ulong)(level + 1);
      }
    }
    psVar1 = p->pSat;
    Abc_Print(level,
              "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n"
              ,((double)level * 100.0) / (double)psVar1->size,(ulong)(uint)psVar1->nLearntStart,
              (ulong)(uint)psVar1->nLearntDelta,(ulong)(uint)psVar1->nLearntRatio,
              (ulong)(uint)psVar1->nDBreduces,(ulong)(uint)psVar1->size,uVar4);
    Abc_Print(p->nUniProps,
              "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n",
              (ulong)(uint)p->nBufNum,(ulong)(uint)p->nDupNum,(ulong)(uint)p->nHashHit,
              (ulong)(uint)p->nHashMiss,(ulong)(uint)p->nUniProps);
  }
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                    ,0x316,"void Saig_Bmc3ManStop(Gia_ManBmc_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  __ptr = p->vVisited;
  __ptr_03 = __ptr->pArray;
  lVar3 = 8;
  for (lVar5 = 0; lVar5 < __ptr->nCap; lVar5 = lVar5 + 1) {
    __ptr_00 = *(void **)((long)&__ptr_03->nCap + lVar3);
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
      __ptr_03 = __ptr->pArray;
      *(undefined8 *)((long)&__ptr_03->nCap + lVar3) = 0;
    }
    lVar3 = lVar3 + 0x10;
  }
  free(__ptr_03);
  free(__ptr);
  Vec_IntFree(p->vMapping);
  Vec_IntFree(p->vMapRefs);
  Vec_IntFree(p->vId2Num);
  Vec_VecFree((Vec_Vec_t *)p->vId2Var);
  Vec_PtrFreeFree(p->vTerInfo);
  sat_solver_delete(p->pSat);
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  Vec_IntFree(p->vData);
  __ptr_01 = p->vHash;
  Vec_IntFree(__ptr_01->vTable);
  __ptr_02 = __ptr_01->vObjs;
  free(__ptr_02->pArray);
  free(__ptr_02);
  free(__ptr_01);
  Vec_IntFree(p->vId2Lit);
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  __ptr_04 = p->pSops;
  if (__ptr_04[1] != (char *)0x0) {
    free(__ptr_04[1]);
    p->pSops[1] = (char *)0x0;
    __ptr_04 = p->pSops;
    if (__ptr_04 == (char **)0x0) goto LAB_0044b387;
  }
  free(__ptr_04);
LAB_0044b387:
  free(p);
  return;
}

Assistant:

void Saig_Bmc3ManStop( Gia_ManBmc_t * p )
{
    if ( p->pPars->fVerbose )
    {
        int nUsedVars = sat_solver_count_usedvars(p->pSat);
        Abc_Print( 1, "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n", 
            p->pSat->nLearntStart, p->pSat->nLearntDelta, p->pSat->nLearntRatio, 
            p->pSat->nDBreduces, p->pSat->size, nUsedVars, 100.0*nUsedVars/p->pSat->size );
        Abc_Print( 1, "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n", 
            p->nBufNum, p->nDupNum, p->nHashHit, p->nHashMiss, p->nUniProps );
    }
//    Aig_ManCleanMarkA( p->pAig );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
//    Vec_PtrFreeFree( p->vCexes );
    Vec_WecFree( p->vVisited );
    Vec_IntFree( p->vMapping );
    Vec_IntFree( p->vMapRefs );
//    Vec_VecFree( p->vSects );
    Vec_IntFree( p->vId2Num );
    Vec_VecFree( (Vec_Vec_t *)p->vId2Var );
    Vec_PtrFreeFree( p->vTerInfo );
    sat_solver_delete( p->pSat );
    ABC_FREE( p->pTime4Outs );
    Vec_IntFree( p->vData );
    Hsh_IntManStop( p->vHash );
    Vec_IntFree( p->vId2Lit );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}